

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickhull.hpp
# Opt level: O3

void __thiscall
quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>
::replace_neighbour(quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>
                    *this,size_type f,size_type _from,size_type _to)

{
  size_type *psVar1;
  ulong uVar2;
  ulong uVar3;
  _Elt_pointer pfVar4;
  
  if (_from == _to) {
    return;
  }
  pfVar4 = (this->facets_).
           super__Deque_base<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_std::allocator<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  uVar3 = ((long)pfVar4 -
           (long)(this->facets_).
                 super__Deque_base<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_std::allocator<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_first >> 3) * -0x2c8590b21642c859 + f;
  if ((long)uVar3 < 0) {
    uVar2 = (long)uVar3 >> 1;
  }
  else {
    if (uVar3 < 2) {
      pfVar4 = pfVar4 + f;
      goto LAB_0010cb03;
    }
    uVar2 = uVar3 >> 1;
  }
  pfVar4 = (this->facets_).
           super__Deque_base<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_std::allocator<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet>_>
           ._M_impl.super__Deque_impl_data._M_start._M_node[uVar2] + uVar3 + uVar2 * -2;
LAB_0010cb03:
  psVar1 = (pfVar4->neighbours_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (psVar1 == (pfVar4->neighbours_).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      return;
    }
    if (*psVar1 == _from) break;
    psVar1 = psVar1 + 1;
  }
  *psVar1 = _to;
  return;
}

Assistant:

void
    replace_neighbour(size_type const f,
                      size_type const _from,
                      size_type const _to)
    {
        if (_from != _to) {
            for (size_type & n : facets_[f].neighbours_) {
                if (n == _from) {
                    n = _to;
                    return;
                }
            }
        }
    }